

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfRequestSub.c
# Opt level: O1

void sbfRequestSubSubMessageCb(sbfSub sub0,sbfBuffer buffer,void *closure)

{
  int *piVar1;
  pthread_spinlock_t *__lock;
  long *__ptr;
  long *plVar2;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  sbfRequest req;
  long *plVar6;
  sbfPoolItem item;
  long lVar7;
  bool bVar8;
  
  uVar3 = buffer->mSize;
  if (0x3f < uVar3) {
    pvVar4 = buffer->mData;
    req = (sbfRequest)sbfMemory_calloc(1,0x68);
    req->mSub = (sbfRequestSub)closure;
    (req->mRefCount).mRefCount = 1;
    sbfGuid_copy(&req->mGuid,pvVar4);
    if (*(long *)((long)closure + 0x18) != 0) {
      if (_gSbfBufferDefaultPool == 0) {
        _gSbfBufferDefaultPool = sbfPool_create1(0x48,"sbfBuffer_wrap",0x58);
        sbfPool_registerAtExit(_gSbfBufferDefaultPool);
      }
      lVar5 = _gSbfBufferDefaultPool;
      LOCK();
      piVar1 = (int *)(*(long *)(_gSbfBufferDefaultPool + 0x28) + 0x18);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      __lock = (pthread_spinlock_t *)(lVar5 + 0x10);
      pthread_spin_lock(__lock);
      plVar6 = *(long **)(lVar5 + 0x18);
      if (plVar6 == (long *)0x0) {
        LOCK();
        plVar6 = *(long **)(lVar5 + 0x20);
        *(undefined8 *)(lVar5 + 0x20) = 0;
        UNLOCK();
      }
      lVar7 = (long)pvVar4 + 0x40;
      if (plVar6 == (long *)0x0) {
        pthread_spin_unlock(__lock);
        LOCK();
        piVar1 = (int *)(*(long *)(lVar5 + 0x28) + 0x20);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
        plVar6 = (long *)sbfMemory_malloc(*(undefined8 *)(lVar5 + 8));
        *plVar6 = lVar5;
        plVar6[1] = 0;
      }
      else {
        *(long *)(lVar5 + 0x18) = plVar6[1];
        pthread_spin_unlock(__lock);
      }
      __ptr = plVar6 + 2;
      *(undefined4 *)(plVar6 + 2) = 0;
      plVar6[5] = 0;
      plVar6[6] = lVar7;
      plVar6[7] = 0;
      plVar6[3] = lVar7;
      plVar6[4] = uVar3 - 0x40;
      plVar6[8] = 1;
      (**(code **)((long)closure + 0x18))(closure,req,__ptr,*(undefined8 *)((long)closure + 0x20));
      LOCK();
      plVar2 = plVar6 + 8;
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        if ((code *)plVar6[5] != (code *)0x0) {
          (*(code *)plVar6[5])(__ptr,plVar6[6],plVar6[7]);
        }
        if ((int)*__ptr == 0) {
          lVar5 = *plVar6;
          LOCK();
          piVar1 = (int *)(*(long *)(lVar5 + 0x28) + 0x1c);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
          do {
            lVar7 = *(long *)(lVar5 + 0x20);
            plVar6[1] = lVar7;
            LOCK();
            bVar8 = lVar7 == *(long *)(lVar5 + 0x20);
            if (bVar8) {
              *(long *)(lVar5 + 0x20) = (long)plVar6;
            }
            UNLOCK();
          } while (!bVar8);
        }
        else {
          free(__ptr);
        }
      }
    }
    sbfRequest_destroy(req);
    return;
  }
  return;
}

Assistant:

static void
sbfRequestSubSubMessageCb (sbfSub sub0, sbfBuffer buffer, void* closure)
{
    sbfRequestSub     sub = closure;
    sbfRequestHeader* hdr = sbfBuffer_getData (buffer);
    size_t            size = sbfBuffer_getSize (buffer);
    sbfBuffer         new;
    sbfRequest        req;

    if (size < sizeof *hdr)
        return;

    req = xcalloc (1, sizeof *req);
    req->mSub = sub;
    sbfRefCount_init (&req->mRefCount, 1);

    sbfGuid_copy (&req->mGuid, &hdr->mGuid);

    if (sub->mRequestCb != NULL)
    {
        new = sbfBuffer_wrap (hdr + 1, size - sizeof *hdr, NULL, NULL);
        sub->mRequestCb (sub, req, new, sub->mClosure);
        sbfBuffer_destroy (new);
    }

    sbfRequest_destroy (req);
}